

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalKdevelopGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalKdevelopGenerator::CreateNewProjectFile
          (cmGlobalKdevelopGenerator *this,string *outputDir,string *projectDir,string *filename,
          string *executable,string *cmakeFilePattern,string *fileToOpen,string *sessionFilename)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  pointer pcVar3;
  cmGlobalGenerator *pcVar4;
  cmMakefile *this_00;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *content;
  char *__end;
  cmGeneratedFileStream devses;
  cmXMLWriter sesxml;
  string primaryLanguage;
  cmGeneratedFileStream fout;
  cmXMLWriter local_5b0;
  string local_560;
  undefined1 local_540 [32];
  byte abStack_520 [552];
  cmGlobalKdevelopGenerator *local_2f8;
  undefined1 local_2f0 [80];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  string *local_280;
  undefined1 local_278 [584];
  
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_278,(filename->_M_dataplus)._M_p,false,None);
  if (((byte)(*(_func_int **)(local_278._0_8_ + -0x18))[(long)(local_278 + 0x20)] & 5) != 0)
  goto LAB_00424a71;
  local_2f8 = this;
  local_280 = cmakeFilePattern;
  cmXMLWriter::cmXMLWriter(&local_5b0,(ostream *)local_278,0);
  pcVar2 = local_540 + 0x10;
  pcVar3 = (projectDir->_M_dataplus)._M_p;
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_540,pcVar3,pcVar3 + projectDir->_M_string_length);
  std::__cxx11::string::append(local_540);
  bVar5 = cmsys::SystemTools::FileExists((char *)local_540._0_8_);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  pcVar3 = (projectDir->_M_dataplus)._M_p;
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_540,pcVar3,pcVar3 + projectDir->_M_string_length);
  std::__cxx11::string::append(local_540);
  bVar6 = cmsys::SystemTools::FileExists((char *)local_540._0_8_);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  pcVar4 = (local_2f8->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"C","");
  bVar7 = cmGlobalGenerator::GetLanguageEnabled(pcVar4,(string *)local_540);
  bVar8 = true;
  if (!bVar7) {
    pcVar4 = (local_2f8->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
    local_2f0._0_8_ = local_2f0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"CXX","");
    bVar8 = cmGlobalGenerator::GetLanguageEnabled(pcVar4,(string *)local_2f0);
    if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
      operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
    }
  }
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  pcVar4 = (local_2f8->super_cmExternalMakefileProjectGenerator).GlobalGenerator;
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"Fortran","");
  bVar7 = cmGlobalGenerator::GetLanguageEnabled(pcVar4,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_2a0._M_dataplus._M_p = (pointer)&local_2a0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a0,"C++","");
  if (bVar7 && bVar8 == false) {
    std::__cxx11::string::_M_replace
              ((ulong)&local_2a0,0,(char *)local_2a0._M_string_length,0x64dfb7);
  }
  cmXMLWriter::StartDocument(&local_5b0,"UTF-8");
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"kdevelop","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"general","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"author","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[1]>(&local_5b0,(char (*) [1])0x66eafa);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"email","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[1]>(&local_5b0,(char (*) [1])0x66eafa);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"version","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[10]>(&local_5b0,(char (*) [10])"$VERSION$");
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"projectmanagement","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[18]>(&local_5b0,(char (*) [18])"KDevCustomProject");
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"primarylanguage","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<std::__cxx11::string>(&local_5b0,&local_2a0);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  cmXMLWriter::Element(&local_5b0,"ignoreparts");
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"projectdirectory","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<std::__cxx11::string>(&local_5b0,projectDir);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"absoluteprojectpath","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[5]>(&local_5b0,(char (*) [5])0x6501df);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"secondaryLanguages","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  if ((bVar8 & bVar7) == 1) {
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"language","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[8]>(&local_5b0,(char (*) [8])0x6601bf);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
  }
  if (bVar8 != false) {
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"language","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[2]>(&local_5b0,(char (*) [2])0x629207);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
  }
  cmXMLWriter::EndElement(&local_5b0);
  if (bVar5) {
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"versioncontrol","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[15]>(&local_5b0,(char (*) [15])"kdevsubversion");
    cmXMLWriter::EndElement(&local_5b0);
LAB_00422b25:
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
  }
  else if (bVar6) {
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"versioncontrol","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[15]>(&local_5b0,(char (*) [15])"kdevcvsservice");
    cmXMLWriter::EndElement(&local_5b0);
    goto LAB_00422b25;
  }
  cmXMLWriter::EndElement(&local_5b0);
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"kdevcustomproject","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"filelistdirectory","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<std::__cxx11::string>(&local_5b0,outputDir);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"run","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"mainprogram","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<std::__cxx11::string>(&local_5b0,executable);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"directoryradio","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[7]>(&local_5b0,(char (*) [7])0x655568);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"customdirectory","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<std::__cxx11::string>(&local_5b0,outputDir);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"programargs","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[1]>(&local_5b0,(char (*) [1])0x66eafa);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"terminal","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[6]>(&local_5b0,(char (*) [6])0x6618d2);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"autocompile","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[5]>(&local_5b0,(char (*) [5])0x6501df);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  cmXMLWriter::Element(&local_5b0,"envvars");
  cmXMLWriter::EndElement(&local_5b0);
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"build","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"buildtool","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[5]>(&local_5b0,(char (*) [5])0x659503);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"builddir","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<std::__cxx11::string>(&local_5b0,outputDir);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  cmXMLWriter::EndElement(&local_5b0);
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"make","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"abortonerror","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[6]>(&local_5b0,(char (*) [6])0x6618d2);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"numberofjobs","");
  local_2f0._0_4_ = 1;
  cmXMLWriter::Element<int>(&local_5b0,(string *)local_540,(int *)local_2f0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"dontact","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[6]>(&local_5b0,(char (*) [6])0x6618d2);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"makebin","");
  this_00 = (*(((local_2f8->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->
              LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start)->Makefile;
  local_2f0._0_8_ = local_2f0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2f0,"CMAKE_MAKE_PROGRAM","");
  local_560._M_dataplus._M_p = cmMakefile::GetRequiredDefinition(this_00,(string *)local_2f0);
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char_const*>(&local_5b0,(char **)&local_560);
  cmXMLWriter::EndElement(&local_5b0);
  if ((undefined1 *)local_2f0._0_8_ != local_2f0 + 0x10) {
    operator_delete((void *)local_2f0._0_8_,local_2f0._16_8_ + 1);
  }
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"selectedenvironment","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[8]>(&local_5b0,(char (*) [8])0x689673);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"environments","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"default","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"envvar","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_4_ = 1;
  cmXMLWriter::Attribute<int>(&local_5b0,"value",(int *)local_540);
  cmXMLWriter::Attribute<char[8]>(&local_5b0,"name",(char (*) [8])0x6423cb);
  cmXMLWriter::EndElement(&local_5b0);
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"envvar","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_4_ = 1;
  cmXMLWriter::Attribute<int>(&local_5b0,"value",(int *)local_540);
  cmXMLWriter::Attribute<char[17]>(&local_5b0,"name",(char (*) [17])"CMAKE_NO_VERBOSE");
  cmXMLWriter::EndElement(&local_5b0);
  cmXMLWriter::EndElement(&local_5b0);
  cmXMLWriter::EndElement(&local_5b0);
  cmXMLWriter::EndElement(&local_5b0);
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"blacklist","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  content = (local_2f8->Blacklist).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (content !=
      (local_2f8->Blacklist).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      local_540._0_8_ = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"path","");
      cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
      cmXMLWriter::Content<std::__cxx11::string>(&local_5b0,content);
      cmXMLWriter::EndElement(&local_5b0);
      if ((char *)local_540._0_8_ != pcVar2) {
        operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
      }
      content = content + 1;
    } while (content !=
             (local_2f8->Blacklist).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  cmXMLWriter::EndElement(&local_5b0);
  cmXMLWriter::EndElement(&local_5b0);
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"kdevfilecreate","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  cmXMLWriter::Element(&local_5b0,"filetypes");
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"useglobaltypes","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"type","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  cmXMLWriter::Attribute<char[3]>(&local_5b0,"ext",(char (*) [3])0x64e479);
  cmXMLWriter::EndElement(&local_5b0);
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"type","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  cmXMLWriter::Attribute<char[4]>(&local_5b0,"ext",(char (*) [4])0x683f1d);
  cmXMLWriter::EndElement(&local_5b0);
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"type","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  cmXMLWriter::Attribute<char[2]>(&local_5b0,"ext",(char (*) [2])0x64571a);
  cmXMLWriter::EndElement(&local_5b0);
  cmXMLWriter::EndElement(&local_5b0);
  cmXMLWriter::EndElement(&local_5b0);
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"kdevdoctreeview","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"projectdoc","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"userdocDir","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[6]>(&local_5b0,(char (*) [6])"html/");
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"apidocDir","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[6]>(&local_5b0,(char (*) [6])"html/");
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  cmXMLWriter::EndElement(&local_5b0);
  cmXMLWriter::Element(&local_5b0,"ignoreqt_xml");
  cmXMLWriter::Element(&local_5b0,"ignoredoxygen");
  cmXMLWriter::Element(&local_5b0,"ignorekdocs");
  cmXMLWriter::Element(&local_5b0,"ignoretocs");
  cmXMLWriter::Element(&local_5b0,"ignoredevhelp");
  cmXMLWriter::EndElement(&local_5b0);
  if (bVar8 != false) {
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"cppsupportpart","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"filetemplates","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"interfacesuffix","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[3]>(&local_5b0,(char (*) [3])0x63e01f);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"implementationsuffix","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[5]>(&local_5b0,(char (*) [5])0x683f1c);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    cmXMLWriter::EndElement(&local_5b0);
    cmXMLWriter::EndElement(&local_5b0);
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"kdevcppsupport","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"codecompletion","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"includeGlobalFunctions","")
    ;
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[5]>(&local_5b0,(char (*) [5])0x6501df);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"includeTypes","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[5]>(&local_5b0,(char (*) [5])0x6501df);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"includeEnums","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[5]>(&local_5b0,(char (*) [5])0x6501df);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"includeTypedefs","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[6]>(&local_5b0,(char (*) [6])0x6618d2);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_540,"automaticCodeCompletion","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[5]>(&local_5b0,(char (*) [5])0x6501df);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"automaticArgumentsHint","")
    ;
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[5]>(&local_5b0,(char (*) [5])0x6501df);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_540,"automaticHeaderCompletion","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[5]>(&local_5b0,(char (*) [5])0x6501df);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"codeCompletionDelay","");
    local_2f0._0_4_ = 0xfa;
    cmXMLWriter::Element<int>(&local_5b0,(string *)local_540,(int *)local_2f0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"argumentsHintDelay","");
    local_2f0._0_4_ = 400;
    cmXMLWriter::Element<int>(&local_5b0,(string *)local_540,(int *)local_2f0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"headerCompletionDelay","");
    local_2f0._0_4_ = 0xfa;
    cmXMLWriter::Element<int>(&local_5b0,(string *)local_540,(int *)local_2f0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    cmXMLWriter::EndElement(&local_5b0);
    cmXMLWriter::Element(&local_5b0,"references");
    cmXMLWriter::EndElement(&local_5b0);
  }
  if (bVar7) {
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"kdevfortransupport","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"ftnchek","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"division","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[6]>(&local_5b0,(char (*) [6])0x6618d2);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"extern","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[6]>(&local_5b0,(char (*) [6])0x6618d2);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"declare","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[6]>(&local_5b0,(char (*) [6])0x6618d2);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"pure","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[6]>(&local_5b0,(char (*) [6])0x6618d2);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"argumentsall","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[6]>(&local_5b0,(char (*) [6])0x6618d2);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"commonall","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[6]>(&local_5b0,(char (*) [6])0x6618d2);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"truncationall","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[6]>(&local_5b0,(char (*) [6])0x6618d2);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"usageall","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[6]>(&local_5b0,(char (*) [6])0x6618d2);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"f77all","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[6]>(&local_5b0,(char (*) [6])0x6618d2);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"portabilityall","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    cmXMLWriter::Content<char[6]>(&local_5b0,(char (*) [6])0x6618d2);
    cmXMLWriter::EndElement(&local_5b0);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    cmXMLWriter::Element(&local_5b0,"argumentsonly");
    cmXMLWriter::Element(&local_5b0,"commononly");
    cmXMLWriter::Element(&local_5b0,"truncationonly");
    cmXMLWriter::Element(&local_5b0,"usageonly");
    cmXMLWriter::Element(&local_5b0,"f77only");
    cmXMLWriter::Element(&local_5b0,"portabilityonly");
    cmXMLWriter::EndElement(&local_5b0);
    cmXMLWriter::EndElement(&local_5b0);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"kdevfileview","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"groups","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"group","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  cmXMLWriter::Attribute<std::__cxx11::string>(&local_5b0,"pattern",local_280);
  cmXMLWriter::Attribute<char[6]>(&local_5b0,"name",(char (*) [6])0x6353c4);
  cmXMLWriter::EndElement(&local_5b0);
  if (bVar8 != false) {
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"group","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    cmXMLWriter::Attribute<char[16]>(&local_5b0,"pattern",(char (*) [16])"*.h;*.hxx;*.hpp");
    cmXMLWriter::Attribute<char[7]>(&local_5b0,"name",(char (*) [7])0x6559d3);
    cmXMLWriter::EndElement(&local_5b0);
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"group","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    cmXMLWriter::Attribute<char[4]>(&local_5b0,"pattern",(char (*) [4])"*.c");
    cmXMLWriter::Attribute<char[10]>(&local_5b0,"name",(char (*) [10])"C Sources");
    cmXMLWriter::EndElement(&local_5b0);
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"group","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    cmXMLWriter::Attribute<char[21]>(&local_5b0,"pattern",(char (*) [21])"*.cpp;*.C;*.cxx;*.cc");
    cmXMLWriter::Attribute<char[12]>(&local_5b0,"name",(char (*) [12])"C++ Sources");
    cmXMLWriter::EndElement(&local_5b0);
  }
  if (bVar7) {
    local_540._0_8_ = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"group","");
    cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
    if ((char *)local_540._0_8_ != pcVar2) {
      operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
    }
    cmXMLWriter::Attribute<char[50]>
              (&local_5b0,"pattern",
               (char (*) [50])"*.f;*.F;*.f77;*.F77;*.f90;*.F90;*.for;*.f95;*.F95");
    cmXMLWriter::Attribute<char[16]>(&local_5b0,"name",(char (*) [16])"Fortran Sources");
    cmXMLWriter::EndElement(&local_5b0);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"group","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  cmXMLWriter::Attribute<char[5]>(&local_5b0,"pattern",(char (*) [5])"*.ui");
  cmXMLWriter::Attribute<char[18]>(&local_5b0,"name",(char (*) [18])"Qt Designer files");
  cmXMLWriter::EndElement(&local_5b0);
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"hidenonprojectfiles","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[5]>(&local_5b0,(char (*) [5])0x6501df);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  cmXMLWriter::EndElement(&local_5b0);
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"tree","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"hidepatterns","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[23]>(&local_5b0,(char (*) [23])"*.o,*.lo,CVS,*~,cmake*");
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  local_540._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_540,"hidenonprojectfiles","");
  cmXMLWriter::StartElement(&local_5b0,(string *)local_540);
  cmXMLWriter::Content<char[5]>(&local_5b0,(char (*) [5])0x6501df);
  cmXMLWriter::EndElement(&local_5b0);
  if ((char *)local_540._0_8_ != pcVar2) {
    operator_delete((void *)local_540._0_8_,local_540._16_8_ + 1);
  }
  cmXMLWriter::EndElement(&local_5b0);
  cmXMLWriter::EndElement(&local_5b0);
  cmXMLWriter::EndElement(&local_5b0);
  cmXMLWriter::EndDocument(&local_5b0);
  if (sessionFilename->_M_string_length != 0) {
    cmGeneratedFileStream::cmGeneratedFileStream
              ((cmGeneratedFileStream *)local_540,(sessionFilename->_M_dataplus)._M_p,false,None);
    if ((abStack_520[*(long *)(local_540._0_8_ + -0x18)] & 5) == 0) {
      cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_2f0,(ostream *)local_540,0);
      cmXMLWriter::StartDocument((cmXMLWriter *)local_2f0,"UTF-8");
      cmXMLWriter::Doctype((cmXMLWriter *)local_2f0,"KDevPrjSession");
      paVar1 = &local_560.field_2;
      local_560._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"KDevPrjSession","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_2f0,&local_560);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560._M_dataplus._M_p != paVar1) {
        operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
      }
      local_560._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"DocsAndViews","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_2f0,&local_560);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560._M_dataplus._M_p != paVar1) {
        operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
      }
      local_560._M_dataplus._M_p._0_4_ = 1;
      cmXMLWriter::Attribute<int>((cmXMLWriter *)local_2f0,"NumberOfDocuments",(int *)&local_560);
      local_560._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"Doc0","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_2f0,&local_560);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560._M_dataplus._M_p != paVar1) {
        operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
      }
      local_560._M_dataplus._M_p._0_4_ = 1;
      cmXMLWriter::Attribute<int>((cmXMLWriter *)local_2f0,"NumberOfViews",(int *)&local_560);
      std::operator+(&local_560,"file://",fileToOpen);
      cmXMLWriter::Attribute<std::__cxx11::string>((cmXMLWriter *)local_2f0,"URL",&local_560);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560._M_dataplus._M_p != paVar1) {
        operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
      }
      local_560._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_560,"View0","");
      cmXMLWriter::StartElement((cmXMLWriter *)local_2f0,&local_560);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560._M_dataplus._M_p != paVar1) {
        operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
      }
      local_560._M_dataplus._M_p = local_560._M_dataplus._M_p & 0xffffffff00000000;
      cmXMLWriter::Attribute<int>((cmXMLWriter *)local_2f0,"line",(int *)&local_560);
      cmXMLWriter::Attribute<char[7]>((cmXMLWriter *)local_2f0,"Type",(char (*) [7])0x657357);
      cmXMLWriter::EndElement((cmXMLWriter *)local_2f0);
      cmXMLWriter::EndElement((cmXMLWriter *)local_2f0);
      cmXMLWriter::EndElement((cmXMLWriter *)local_2f0);
      cmXMLWriter::EndElement((cmXMLWriter *)local_2f0);
      cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_2f0);
    }
    cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_540);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  cmXMLWriter::~cmXMLWriter(&local_5b0);
LAB_00424a71:
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_278);
  return;
}

Assistant:

void cmGlobalKdevelopGenerator::CreateNewProjectFile(
  const std::string& outputDir, const std::string& projectDir,
  const std::string& filename, const std::string& executable,
  const std::string& cmakeFilePattern, const std::string& fileToOpen,
  const std::string& sessionFilename)
{
  cmGeneratedFileStream fout(filename.c_str());
  if (!fout) {
    return;
  }
  cmXMLWriter xml(fout);

  // check for a version control system
  bool hasSvn = cmSystemTools::FileExists((projectDir + "/.svn").c_str());
  bool hasCvs = cmSystemTools::FileExists((projectDir + "/CVS").c_str());

  bool enableCxx = (this->GlobalGenerator->GetLanguageEnabled("C") ||
                    this->GlobalGenerator->GetLanguageEnabled("CXX"));
  bool enableFortran = this->GlobalGenerator->GetLanguageEnabled("Fortran");
  std::string primaryLanguage = "C++";
  if (enableFortran && !enableCxx) {
    primaryLanguage = "Fortran77";
  }

  xml.StartDocument();
  xml.StartElement("kdevelop");
  xml.StartElement("general");

  xml.Element("author", "");
  xml.Element("email", "");
  xml.Element("version", "$VERSION$");
  xml.Element("projectmanagement", "KDevCustomProject");
  xml.Element("primarylanguage", primaryLanguage);
  xml.Element("ignoreparts");
  xml.Element("projectdirectory", projectDir); // this one is important
  xml.Element("absoluteprojectpath", "true");  // and this one

  // setup additional languages
  xml.StartElement("secondaryLanguages");
  if (enableFortran && enableCxx) {
    xml.Element("language", "Fortran");
  }
  if (enableCxx) {
    xml.Element("language", "C");
  }
  xml.EndElement();

  if (hasSvn) {
    xml.Element("versioncontrol", "kdevsubversion");
  } else if (hasCvs) {
    xml.Element("versioncontrol", "kdevcvsservice");
  }

  xml.EndElement(); // general
  xml.StartElement("kdevcustomproject");

  xml.Element("filelistdirectory", outputDir);

  xml.StartElement("run");
  xml.Element("mainprogram", executable);
  xml.Element("directoryradio", "custom");
  xml.Element("customdirectory", outputDir);
  xml.Element("programargs", "");
  xml.Element("terminal", "false");
  xml.Element("autocompile", "true");
  xml.Element("envvars");
  xml.EndElement();

  xml.StartElement("build");
  xml.Element("buildtool", "make");   // this one is important
  xml.Element("builddir", outputDir); // and this one
  xml.EndElement();

  xml.StartElement("make");
  xml.Element("abortonerror", "false");
  xml.Element("numberofjobs", 1);
  xml.Element("dontact", "false");
  xml.Element("makebin", this->GlobalGenerator->GetLocalGenerators()[0]
                           ->GetMakefile()
                           ->GetRequiredDefinition("CMAKE_MAKE_PROGRAM"));
  xml.Element("selectedenvironment", "default");

  xml.StartElement("environments");
  xml.StartElement("default");

  xml.StartElement("envvar");
  xml.Attribute("value", 1);
  xml.Attribute("name", "VERBOSE");
  xml.EndElement();

  xml.StartElement("envvar");
  xml.Attribute("value", 1);
  xml.Attribute("name", "CMAKE_NO_VERBOSE");
  xml.EndElement();

  xml.EndElement(); // default
  xml.EndElement(); // environments
  xml.EndElement(); // make

  xml.StartElement("blacklist");
  for (std::vector<std::string>::const_iterator dirIt =
         this->Blacklist.begin();
       dirIt != this->Blacklist.end(); ++dirIt) {
    xml.Element("path", *dirIt);
  }
  xml.EndElement();

  xml.EndElement(); // kdevcustomproject

  xml.StartElement("kdevfilecreate");
  xml.Element("filetypes");
  xml.StartElement("useglobaltypes");

  xml.StartElement("type");
  xml.Attribute("ext", "ui");
  xml.EndElement();

  xml.StartElement("type");
  xml.Attribute("ext", "cpp");
  xml.EndElement();

  xml.StartElement("type");
  xml.Attribute("ext", "h");
  xml.EndElement();

  xml.EndElement(); // useglobaltypes
  xml.EndElement(); // kdevfilecreate

  xml.StartElement("kdevdoctreeview");
  xml.StartElement("projectdoc");
  xml.Element("userdocDir", "html/");
  xml.Element("apidocDir", "html/");
  xml.EndElement(); // projectdoc
  xml.Element("ignoreqt_xml");
  xml.Element("ignoredoxygen");
  xml.Element("ignorekdocs");
  xml.Element("ignoretocs");
  xml.Element("ignoredevhelp");
  xml.EndElement(); // kdevdoctreeview;

  if (enableCxx) {
    xml.StartElement("cppsupportpart");
    xml.StartElement("filetemplates");
    xml.Element("interfacesuffix", ".h");
    xml.Element("implementationsuffix", ".cpp");
    xml.EndElement(); // filetemplates
    xml.EndElement(); // cppsupportpart

    xml.StartElement("kdevcppsupport");
    xml.StartElement("codecompletion");
    xml.Element("includeGlobalFunctions", "true");
    xml.Element("includeTypes", "true");
    xml.Element("includeEnums", "true");
    xml.Element("includeTypedefs", "false");
    xml.Element("automaticCodeCompletion", "true");
    xml.Element("automaticArgumentsHint", "true");
    xml.Element("automaticHeaderCompletion", "true");
    xml.Element("codeCompletionDelay", 250);
    xml.Element("argumentsHintDelay", 400);
    xml.Element("headerCompletionDelay", 250);
    xml.EndElement(); // codecompletion
    xml.Element("references");
    xml.EndElement(); // kdevcppsupport;
  }

  if (enableFortran) {
    xml.StartElement("kdevfortransupport");
    xml.StartElement("ftnchek");
    xml.Element("division", "false");
    xml.Element("extern", "false");
    xml.Element("declare", "false");
    xml.Element("pure", "false");
    xml.Element("argumentsall", "false");
    xml.Element("commonall", "false");
    xml.Element("truncationall", "false");
    xml.Element("usageall", "false");
    xml.Element("f77all", "false");
    xml.Element("portabilityall", "false");
    xml.Element("argumentsonly");
    xml.Element("commononly");
    xml.Element("truncationonly");
    xml.Element("usageonly");
    xml.Element("f77only");
    xml.Element("portabilityonly");
    xml.EndElement(); // ftnchek
    xml.EndElement(); // kdevfortransupport;
  }

  // set up file groups. maybe this can be used with the CMake SOURCE_GROUP()
  // command
  xml.StartElement("kdevfileview");
  xml.StartElement("groups");

  xml.StartElement("group");
  xml.Attribute("pattern", cmakeFilePattern);
  xml.Attribute("name", "CMake");
  xml.EndElement();

  if (enableCxx) {
    xml.StartElement("group");
    xml.Attribute("pattern", "*.h;*.hxx;*.hpp");
    xml.Attribute("name", "Header");
    xml.EndElement();

    xml.StartElement("group");
    xml.Attribute("pattern", "*.c");
    xml.Attribute("name", "C Sources");
    xml.EndElement();

    xml.StartElement("group");
    xml.Attribute("pattern", "*.cpp;*.C;*.cxx;*.cc");
    xml.Attribute("name", "C++ Sources");
    xml.EndElement();
  }

  if (enableFortran) {
    xml.StartElement("group");
    xml.Attribute("pattern",
                  "*.f;*.F;*.f77;*.F77;*.f90;*.F90;*.for;*.f95;*.F95");
    xml.Attribute("name", "Fortran Sources");
    xml.EndElement();
  }

  xml.StartElement("group");
  xml.Attribute("pattern", "*.ui");
  xml.Attribute("name", "Qt Designer files");
  xml.EndElement();

  xml.Element("hidenonprojectfiles", "true");
  xml.EndElement(); // groups

  xml.StartElement("tree");
  xml.Element("hidepatterns", "*.o,*.lo,CVS,*~,cmake*");
  xml.Element("hidenonprojectfiles", "true");
  xml.EndElement(); // tree

  xml.EndElement(); // kdevfileview
  xml.EndElement(); // kdevelop;
  xml.EndDocument();

  if (sessionFilename.empty()) {
    return;
  }

  // and a session file, so that kdevelop opens a file if it opens the
  // project the first time
  cmGeneratedFileStream devses(sessionFilename.c_str());
  if (!devses) {
    return;
  }
  cmXMLWriter sesxml(devses);
  sesxml.StartDocument("UTF-8");
  sesxml.Doctype("KDevPrjSession");
  sesxml.StartElement("KDevPrjSession");

  sesxml.StartElement("DocsAndViews");
  sesxml.Attribute("NumberOfDocuments", 1);

  sesxml.StartElement("Doc0");
  sesxml.Attribute("NumberOfViews", 1);
  sesxml.Attribute("URL", "file://" + fileToOpen);

  sesxml.StartElement("View0");
  sesxml.Attribute("line", 0);
  sesxml.Attribute("Type", "Source");
  sesxml.EndElement(); // View0

  sesxml.EndElement(); // Doc0
  sesxml.EndElement(); // DocsAndViews
  sesxml.EndElement(); // KDevPrjSession;
}